

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Handler.cpp
# Opt level: O0

void __thiscall Handler::InputRequest(Handler *this,uint16_t *startDay,uint16_t *endDay)

{
  uint uVar1;
  char *pcVar2;
  mapped_type *pmVar3;
  long lVar4;
  reference pvVar5;
  reference pvVar6;
  value_type vVar7;
  ushort *in_RDX;
  ushort *in_RSI;
  long in_RDI;
  int k;
  int id;
  Request req;
  uint32_t j;
  uint32_t addRequestCount;
  vector<Request,_std::allocator<Request>_> request;
  string idStr;
  string modelStr;
  string operationStr;
  uint32_t R;
  uint16_t i;
  uint16_t vmIdx;
  string RStr;
  undefined4 in_stack_fffffffffffffe78;
  value_type in_stack_fffffffffffffe7c;
  string *in_stack_fffffffffffffe80;
  allocator_type *in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe98;
  int in_stack_fffffffffffffe9c;
  vector<Request,_std::allocator<Request>_> *in_stack_fffffffffffffea0;
  int local_110;
  int local_10c;
  string local_108 [32];
  undefined4 in_stack_ffffffffffffff18;
  uint in_stack_ffffffffffffff1c;
  value_type in_stack_ffffffffffffff20;
  mapped_type in_stack_ffffffffffffff24;
  undefined2 in_stack_ffffffffffffff26;
  uint local_d4;
  value_type local_d0;
  vector<Request,_std::allocator<Request>_> local_c8;
  string local_a0 [32];
  string local_80 [32];
  string local_60 [32];
  uint local_40;
  ushort local_3c;
  mapped_type local_3a;
  string local_38 [32];
  ushort *local_18;
  ushort *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::__cxx11::string::string(local_38);
  for (local_3c = *local_10; local_3c < *local_18; local_3c = local_3c + 1) {
    std::__cxx11::string::string(local_60);
    std::__cxx11::string::string(local_80);
    std::__cxx11::string::string(local_a0);
    std::operator>>((istream *)&std::cin,local_38);
    local_40 = std::__cxx11::stoi(in_stack_fffffffffffffe80,
                                  (size_t *)
                                  CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),0);
    local_40 = local_40 & 0xffff;
    std::vector<Result,_std::allocator<Result>_>::operator[]
              ((vector<Result,_std::allocator<Result>_> *)(in_RDI + 0x66a18),(ulong)local_3c);
    std::vector<RequestResult,_std::allocator<RequestResult>_>::resize
              ((vector<RequestResult,_std::allocator<RequestResult>_> *)in_stack_fffffffffffffea0,
               CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    std::allocator<Request>::allocator((allocator<Request> *)0x128f7e);
    std::vector<Request,_std::allocator<Request>_>::vector
              (in_stack_fffffffffffffea0,
               CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
               in_stack_fffffffffffffe90);
    std::allocator<Request>::~allocator((allocator<Request> *)0x128fa4);
    local_d0 = 0;
    for (local_d4 = 0; local_d4 < local_40; local_d4 = local_d4 + 1) {
      Request::Request((Request *)&stack0xffffffffffffff1c);
      std::operator>>((istream *)&std::cin,local_60);
      pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_60);
      in_stack_ffffffffffffff1c = CONCAT31((int3)(in_stack_ffffffffffffff1c >> 8),*pcVar2 == 'a');
      if (*pcVar2 == 'a') {
        std::operator>>((istream *)&std::cin,local_80);
        std::__cxx11::string::size();
        std::__cxx11::string::substr((ulong)local_108,(ulong)local_80);
        pmVar3 = std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>_>
                 ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>_>
                               *)in_stack_fffffffffffffe80,
                              (key_type *)
                              CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
        local_3a = *pmVar3;
        std::__cxx11::string::~string(local_108);
      }
      std::operator>>((istream *)&std::cin,local_a0);
      local_10c = 0;
      local_110 = 0;
      while( true ) {
        lVar4 = std::__cxx11::string::size();
        if (lVar4 - 1U <= (ulong)(long)local_110) break;
        in_stack_fffffffffffffe9c = local_10c * 10;
        in_stack_fffffffffffffea0 =
             (vector<Request,_std::allocator<Request>_> *)
             std::__cxx11::string::operator[]((ulong)local_a0);
        local_10c = in_stack_fffffffffffffe9c +
                    *(char *)&(in_stack_fffffffffffffea0->
                              super__Vector_base<Request,_std::allocator<Request>_>)._M_impl.
                              super__Vector_impl_data._M_start + -0x30;
        local_110 = local_110 + 1;
      }
      if ((in_stack_ffffffffffffff1c & 1) == 0) {
        in_stack_fffffffffffffe80 =
             (string *)
             std::
             unordered_map<int,_unsigned_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
             ::operator[]((unordered_map<int,_unsigned_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
                           *)in_stack_fffffffffffffe80,
                          (key_type *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78))
        ;
        in_stack_ffffffffffffff24 = (mapped_type)*(mapped_type *)in_stack_fffffffffffffe80;
      }
      else {
        vVar7 = local_d0 + 1;
        uVar1 = (uint)local_3a;
        in_stack_ffffffffffffff24 = local_3a;
        in_stack_fffffffffffffe90 =
             (allocator_type *)
             std::
             unordered_map<int,_unsigned_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
             ::operator[]((unordered_map<int,_unsigned_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
                           *)in_stack_fffffffffffffe80,
                          (key_type *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78))
        ;
        *(uint *)in_stack_fffffffffffffe90 = uVar1;
        in_stack_ffffffffffffff20 = local_d0;
        local_d0 = vVar7;
      }
      pvVar5 = std::vector<Request,_std::allocator<Request>_>::operator[](&local_c8,(ulong)local_d4)
      ;
      pvVar5->add = (bool)(char)in_stack_ffffffffffffff1c;
      *(int3 *)&pvVar5->field_0x1 = (int3)(in_stack_ffffffffffffff1c >> 8);
      pvVar5->addIdx = in_stack_ffffffffffffff20;
      pvVar5->vmIdx = in_stack_ffffffffffffff24;
      *(undefined2 *)&pvVar5->field_0xa = in_stack_ffffffffffffff26;
      pvVar5->vmId = local_10c;
    }
    std::
    vector<std::vector<Request,_std::allocator<Request>_>,_std::allocator<std::vector<Request,_std::allocator<Request>_>_>_>
    ::operator[]((vector<std::vector<Request,_std::allocator<Request>_>,_std::allocator<std::vector<Request,_std::allocator<Request>_>_>_>
                  *)(in_RDI + 0x60),(ulong)local_3c);
    std::vector<Request,_std::allocator<Request>_>::operator=
              ((vector<Request,_std::allocator<Request>_> *)
               CONCAT26(in_stack_ffffffffffffff26,
                        CONCAT24(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20)),
               (vector<Request,_std::allocator<Request>_> *)
               CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x78),
                        (ulong)local_3c);
    *pvVar6 = local_d0;
    std::vector<Request,_std::allocator<Request>_>::~vector
              ((vector<Request,_std::allocator<Request>_> *)in_stack_fffffffffffffe90);
    std::__cxx11::string::~string(local_a0);
    std::__cxx11::string::~string(local_80);
    std::__cxx11::string::~string(local_60);
    in_stack_fffffffffffffe7c = local_d0;
  }
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void Handler::InputRequest(const uint16_t &startDay, const uint16_t &endDay) {
    string RStr;
    uint16_t vmIdx;

    for (uint16_t i = startDay; i < endDay; ++i) {
        uint32_t R;
        string operationStr, modelStr, idStr;
        std::cin >> RStr;
        R = (uint16_t) std::stoi(RStr);
        result[i].requestResult.resize(R);
        std::vector<Request> request(R);
        uint32_t addRequestCount = 0u;

        for (uint32_t j = 0u; j < R; ++j) {
            Request req;

            std::cin >> operationStr;
            req.add = (operationStr[1] == 'a');
            if (req.add) {
                std::cin >> modelStr;
                vmIdx = virtualMachineMap[modelStr.substr(0, modelStr.size() - 1)];
            }

            std::cin >> idStr;
            int id = 0;
            for (int k = 0; k < idStr.size() - 1; ++k) {
                id = id * 10 + (idStr[k] - 48);
            }
            req.vmId = id;

            if (req.add) {
                req.addIdx = addRequestCount++;
                req.vmIdx = vmIdx;
                idVirtualMachineMap[id] = vmIdx;
            } else {
                req.vmIdx = idVirtualMachineMap[id];
            }

            request[j] = req;
        }

        requests[i] = request;
        addRequestCounts[i] = addRequestCount;
    }
}